

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libdivide.h
# Opt level: O3

int32_t get_algorithm<unsigned_int>(uint d)

{
  uint *puVar1;
  ulong uVar2;
  int iVar3;
  int32_t iVar4;
  int iVar5;
  uint uVar6;
  uint *in_RSI;
  undefined4 in_register_0000003c;
  long *plVar7;
  long lVar8;
  
  plVar7 = (long *)CONCAT44(in_register_0000003c,d);
  if (d == 0) {
    get_algorithm<unsigned_int>();
    iVar4 = 0;
    if ((ulong)*(uint *)(plVar7 + 1) != 0) {
      lVar8 = 0;
      do {
        puVar1 = (uint *)(*plVar7 + lVar8);
        lVar8 = lVar8 + 4;
        iVar4 = iVar4 + *puVar1 / *in_RSI;
      } while ((ulong)*(uint *)(plVar7 + 1) << 2 != lVar8);
    }
    return iVar4;
  }
  if ((d - 1 & d) != 0) {
    iVar4 = 1;
    uVar6 = 1 << ((byte)~(byte)LZCOUNT(d) & 0x1f);
    uVar2 = (ulong)uVar6 << 0x20;
    iVar3 = (int)(uVar2 / d);
    iVar5 = (int)(uVar2 % (ulong)d);
    if (uVar6 <= d - iVar5) {
      iVar3 = (uint)(iVar5 < 0 || d <= (uint)(iVar5 * 2)) + iVar3 * 2;
      iVar4 = 2;
    }
    if (iVar3 != -1) {
      return iVar4;
    }
  }
  return 0;
}

Assistant:

static LIBDIVIDE_INLINE struct libdivide_u32_t libdivide_internal_u32_gen(
    uint32_t d, int branchfree) {
    if (d == 0) {
        LIBDIVIDE_ERROR("divider must be != 0");
    }

    struct libdivide_u32_t result;
    uint32_t floor_log_2_d = 31 - libdivide_count_leading_zeros32(d);

    // Power of 2
    if ((d & (d - 1)) == 0) {
        // We need to subtract 1 from the shift value in case of an unsigned
        // branchfree divider because there is a hardcoded right shift by 1
        // in its division algorithm. Because of this we also need to add back
        // 1 in its recovery algorithm.
        result.magic = 0;
        result.more = (uint8_t)(floor_log_2_d - (branchfree != 0));
    } else {
        uint8_t more;
        uint32_t rem, proposed_m;
        proposed_m = libdivide_64_div_32_to_32((uint32_t)1 << floor_log_2_d, 0, d, &rem);

        LIBDIVIDE_ASSERT(rem > 0 && rem < d);
        const uint32_t e = d - rem;

        // This power works if e < 2**floor_log_2_d.
        if (!branchfree && (e < ((uint32_t)1 << floor_log_2_d))) {
            // This power works
            more = (uint8_t)floor_log_2_d;
        } else {
            // We have to use the general 33-bit algorithm.  We need to compute
            // (2**power) / d. However, we already have (2**(power-1))/d and
            // its remainder.  By doubling both, and then correcting the
            // remainder, we can compute the larger division.
            // don't care about overflow here - in fact, we expect it
            proposed_m += proposed_m;
            const uint32_t twice_rem = rem + rem;
            if (twice_rem >= d || twice_rem < rem) proposed_m += 1;
            more = (uint8_t)(floor_log_2_d | LIBDIVIDE_ADD_MARKER);
        }
        result.magic = 1 + proposed_m;
        result.more = more;
        // result.more's shift should in general be ceil_log_2_d. But if we
        // used the smaller power, we subtract one from the shift because we're
        // using the smaller power. If we're using the larger power, we
        // subtract one from the shift because it's taken care of by the add
        // indicator. So floor_log_2_d happens to be correct in both cases.
    }
    return result;
}